

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sisd_alignment_engine.cpp
# Opt level: O1

Alignment * __thiscall
spoa::SisdAlignmentEngine::Linear
          (Alignment *__return_storage_ptr__,SisdAlignmentEngine *this,uint32_t sequence_len,
          Graph *graph,int32_t *score)

{
  char cVar1;
  AlignmentType AVar2;
  Implementation *pIVar3;
  long lVar4;
  int32_t *piVar5;
  pointer ppEVar6;
  pointer ppEVar7;
  Node *pNVar8;
  pointer ppVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  uint uVar13;
  uint uVar14;
  long lVar15;
  long lVar16;
  pointer ppVar17;
  uint uVar18;
  ulong uVar19;
  pointer ppVar20;
  uint uVar21;
  int iVar22;
  ulong uVar23;
  int iVar24;
  pointer ppNVar25;
  ulong uVar26;
  long lVar27;
  ulong uVar28;
  int iVar29;
  ulong uVar30;
  int iVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  uint uVar36;
  Alignment *alignment;
  uint local_78;
  uint32_t local_74;
  int32_t *local_70;
  long local_68;
  long local_60;
  long local_58;
  int32_t *local_50;
  long local_48;
  pointer local_40;
  Node *local_38;
  ulong uVar37;
  
  uVar36 = sequence_len + 1;
  uVar37 = (ulong)uVar36;
  AVar2 = (this->super_AlignmentEngine).type_;
  uVar18 = 0x80000400;
  if (AVar2 == kSW) {
    uVar18 = 0;
  }
  ppNVar25 = (graph->rank_to_node_).
             super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_40 = (graph->rank_to_node_).
             super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  if (ppNVar25 == local_40) {
    uVar32 = 0;
    uVar30 = 0;
  }
  else {
    pIVar3 = (this->pimpl_)._M_t.
             super___uniq_ptr_impl<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
             ._M_t.
             super__Tuple_impl<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
             .super__Head_base<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_false>._M_head_impl
    ;
    lVar4 = *(long *)&(pIVar3->node_id_to_rank).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>;
    local_48 = *(long *)&(pIVar3->sequence_profile).super__Vector_base<int,_std::allocator<int>_>.
                         _M_impl;
    piVar5 = pIVar3->H;
    iVar22 = (int)(this->super_AlignmentEngine).g_;
    local_50 = piVar5 + 1;
    local_58 = uVar37 * 4;
    local_60 = uVar37 - 1;
    local_68 = uVar37 - 2;
    uVar30 = 0;
    uVar32 = 0;
    do {
      local_38 = *ppNVar25;
      ppEVar6 = (local_38->inedges).
                super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      ppEVar7 = (local_38->inedges).
                super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      if (ppEVar6 == ppEVar7) {
        uVar26 = 0;
      }
      else {
        uVar26 = (ulong)(*(int *)(lVar4 + (ulong)(*ppEVar6)->tail->id * 4) + 1);
      }
      lVar27 = local_48 + local_38->code * uVar37 * 4;
      uVar13 = *(int *)(lVar4 + (ulong)local_38->id * 4) + 1;
      lVar15 = uVar13 * uVar37;
      if (1 < uVar36) {
        uVar19 = 1;
        do {
          iVar29 = *(int *)(lVar27 + uVar19 * 4) + piVar5[uVar26 * uVar37 + (uVar19 - 1)];
          iVar31 = piVar5[uVar26 * uVar37 + uVar19] + iVar22;
          if (iVar31 < iVar29) {
            iVar31 = iVar29;
          }
          piVar5[lVar15 + uVar19] = iVar31;
          uVar19 = uVar19 + 1;
        } while (uVar37 != uVar19);
      }
      uVar26 = (long)ppEVar7 - (long)ppEVar6 >> 3;
      if (1 < uVar26) {
        cVar1 = (this->super_AlignmentEngine).g_;
        uVar19 = 1;
        do {
          if (1 < uVar36) {
            lVar16 = (*(int *)(lVar4 + (ulong)ppEVar6[uVar19]->tail->id * 4) + 1) * uVar37;
            uVar33 = 1;
            do {
              iVar29 = *(int *)(lVar27 + uVar33 * 4) + piVar5[lVar16 + (uVar33 - 1)];
              iVar31 = piVar5[lVar16 + uVar33] + (int)cVar1;
              if (iVar31 < piVar5[lVar15 + uVar33]) {
                iVar31 = piVar5[lVar15 + uVar33];
              }
              if (iVar31 < iVar29) {
                iVar31 = iVar29;
              }
              piVar5[lVar15 + uVar33] = iVar31;
              uVar33 = uVar33 + 1;
            } while (uVar37 != uVar33);
          }
          uVar19 = (ulong)((int)uVar19 + 1);
        } while (uVar19 < uVar26);
      }
      if (1 < uVar36) {
        lVar15 = (ulong)uVar13 * local_58;
        lVar27 = 0;
        uVar21 = uVar18;
        do {
          uVar14 = *(int *)((long)local_50 + lVar27 * 4 + lVar15 + -4) + iVar22;
          uVar18 = *(uint *)((long)local_50 + lVar27 * 4 + lVar15);
          if ((int)uVar14 <= (int)uVar18) {
            uVar14 = uVar18;
          }
          *(uint *)((long)local_50 + lVar27 * 4 + lVar15) = uVar14;
          uVar18 = uVar21;
          if (AVar2 == kOV) {
            if ((local_38->outedges).
                super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>.
                _M_impl.super__Vector_impl_data._M_start ==
                (local_38->outedges).
                super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>.
                _M_impl.super__Vector_impl_data._M_finish) {
LAB_001161d7:
              uVar14 = *(uint *)((long)local_50 + lVar27 * 4 + lVar15);
              if ((int)uVar21 <= (int)uVar14) {
                uVar18 = uVar14;
              }
              if ((int)uVar21 < (int)uVar14) {
                uVar30 = (ulong)((int)lVar27 + 1);
                uVar32 = (ulong)uVar13;
              }
            }
          }
          else if (AVar2 == kNW) {
            if ((local_68 == lVar27) &&
               ((local_38->outedges).
                super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>.
                _M_impl.super__Vector_impl_data._M_start ==
                (local_38->outedges).
                super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>.
                _M_impl.super__Vector_impl_data._M_finish)) goto LAB_001161d7;
          }
          else if (AVar2 == kSW) {
            uVar14 = ~((int)uVar14 >> 0x1f) & uVar14;
            *(uint *)((long)local_50 + lVar27 * 4 + lVar15) = uVar14;
            if ((int)uVar21 <= (int)uVar14) {
              uVar18 = uVar14;
            }
            if ((int)uVar21 < (int)uVar14) {
              uVar30 = (ulong)((int)lVar27 + 1);
              uVar32 = (ulong)uVar13;
            }
          }
          lVar27 = lVar27 + 1;
          uVar21 = uVar18;
        } while (local_60 != lVar27);
      }
      ppNVar25 = ppNVar25 + 1;
    } while (ppNVar25 != local_40);
  }
  if ((int)uVar32 == 0 && (int)uVar30 == 0) {
    (__return_storage_ptr__->
    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    return __return_storage_ptr__;
  }
  if (score != (int32_t *)0x0) {
    *score = uVar18;
  }
  (__return_storage_ptr__->
  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar26 = 0;
  uVar19 = 0;
  local_70 = score;
  do {
    AVar2 = (this->super_AlignmentEngine).type_;
    iVar31 = (int)uVar32;
    iVar22 = (int)uVar30;
    if (AVar2 == kOV) {
      iVar29 = iVar22;
      if (iVar31 == 0) goto LAB_00116598;
joined_r0x001162d9:
      if (iVar29 == 0) goto LAB_00116598;
    }
    else {
      if (AVar2 != kNW) {
        if (AVar2 == kSW) {
          iVar29 = ((this->pimpl_)._M_t.
                    super___uniq_ptr_impl<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                    .super__Head_base<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_false>.
                   _M_head_impl)->H[uVar32 * uVar37 + uVar30];
          goto joined_r0x001162d9;
        }
LAB_00116598:
        ppVar17 = (__return_storage_ptr__->
                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
                  _M_impl.super__Vector_impl_data._M_start;
        ppVar9 = (__return_storage_ptr__->
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
        ppVar20 = ppVar9 + -1;
        if (ppVar20 <= ppVar17 || ppVar17 == ppVar9) {
          return __return_storage_ptr__;
        }
        do {
          iVar22 = ppVar17->first;
          ppVar17->first = ppVar20->first;
          ppVar20->first = iVar22;
          iVar22 = ppVar17->second;
          ppVar17->second = ppVar20->second;
          ppVar20->second = iVar22;
          ppVar17 = ppVar17 + 1;
          ppVar20 = ppVar20 + -1;
        } while (ppVar17 < ppVar20);
        return __return_storage_ptr__;
      }
      if (iVar31 == 0 && iVar22 == 0) goto LAB_00116598;
    }
    pIVar3 = (this->pimpl_)._M_t.
             super___uniq_ptr_impl<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
             ._M_t.
             super__Tuple_impl<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
             .super__Head_base<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_false>._M_head_impl
    ;
    piVar5 = pIVar3->H;
    iVar29 = piVar5[uVar32 * uVar37 + uVar30];
    bVar12 = false;
    if ((iVar22 != 0) && (iVar31 != 0)) {
      pNVar8 = (graph->rank_to_node_).
               super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>._M_impl
               .super__Vector_impl_data._M_start[iVar31 - 1];
      ppEVar6 = (pNVar8->inedges).
                super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      ppEVar7 = *(pointer *)
                 ((long)&(pNVar8->inedges).
                         super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>
                         ._M_impl + 8);
      if (ppEVar6 == ppEVar7) {
        uVar18 = 0;
      }
      else {
        uVar18 = *(int *)(*(long *)&(pIVar3->node_id_to_rank).
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                         + (ulong)(*ppEVar6)->tail->id * 4) + 1;
      }
      iVar24 = *(int *)(pNVar8->code * uVar37 * 4 +
                        *(long *)&(pIVar3->sequence_profile).
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl + uVar30 * 4
                       );
      uVar33 = (ulong)(iVar22 - 1);
      bVar12 = true;
      if (iVar29 == piVar5[uVar18 * uVar37 + uVar33] + iVar24) {
        uVar26 = (ulong)uVar18;
        uVar19 = uVar33;
      }
      else {
        uVar34 = (long)ppEVar7 - (long)ppEVar6 >> 3;
        if (uVar34 < 2) {
          bVar12 = false;
        }
        else {
          bVar12 = false;
          uVar35 = 1;
          uVar23 = 2;
          do {
            uVar35 = (ulong)(*(int *)(*(long *)&(pIVar3->node_id_to_rank).
                                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     + (ulong)ppEVar6[uVar35]->tail->id * 4) + 1);
            if (iVar29 == piVar5[uVar33 + uVar35 * uVar37] + iVar24) {
              bVar12 = true;
              uVar26 = uVar35;
              uVar19 = uVar33;
              break;
            }
            bVar10 = uVar23 < uVar34;
            uVar35 = uVar23;
            uVar23 = (ulong)((int)uVar23 + 1);
          } while (bVar10);
        }
      }
    }
    uVar33 = uVar19;
    uVar34 = uVar26;
    bVar10 = bVar12;
    if ((iVar31 != 0) && (!bVar12)) {
      pNVar8 = (graph->rank_to_node_).
               super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>._M_impl
               .super__Vector_impl_data._M_start[iVar31 - 1];
      ppEVar6 = (pNVar8->inedges).
                super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      ppEVar7 = *(pointer *)
                 ((long)&(pNVar8->inedges).
                         super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>
                         ._M_impl + 8);
      if (ppEVar6 == ppEVar7) {
        uVar34 = 0;
      }
      else {
        uVar34 = (ulong)(*(int *)(*(long *)&(pIVar3->node_id_to_rank).
                                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                 + (ulong)(*ppEVar6)->tail->id * 4) + 1);
      }
      iVar24 = (int)(this->super_AlignmentEngine).g_;
      uVar33 = uVar30;
      bVar10 = true;
      if ((iVar29 != piVar5[uVar34 * uVar37 + uVar30] + iVar24) &&
         (uVar35 = (long)ppEVar7 - (long)ppEVar6 >> 3, uVar33 = uVar19, uVar34 = uVar26,
         bVar10 = bVar12, 1 < uVar35)) {
        uVar23 = 1;
        uVar28 = 2;
        do {
          uVar34 = (ulong)(*(int *)(*(long *)&(pIVar3->node_id_to_rank).
                                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                   + (ulong)ppEVar6[uVar23]->tail->id * 4) + 1);
          if (iVar29 == piVar5[uVar30 + uVar34 * uVar37] + iVar24) {
            uVar33 = uVar30;
            bVar10 = true;
            break;
          }
          bVar11 = uVar28 < uVar35;
          uVar23 = uVar28;
          uVar28 = (ulong)((int)uVar28 + 1);
          uVar34 = uVar26;
        } while (bVar11);
      }
    }
    uVar26 = uVar34;
    if (!bVar10) {
      uVar18 = (uint)uVar33;
      if (iVar29 == (int)(this->super_AlignmentEngine).g_ + piVar5[uVar32 * uVar37 + (uVar30 - 1)])
      {
        uVar34 = uVar32;
        uVar18 = iVar22 - 1;
      }
      uVar26 = uVar34;
      uVar33 = (ulong)uVar18;
    }
    uVar30 = uVar33;
    local_74 = 0xffffffff;
    if (iVar31 != (int)uVar26) {
      local_74 = (graph->rank_to_node_).
                 super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>.
                 _M_impl.super__Vector_impl_data._M_start[iVar31 - 1]->id;
    }
    local_78 = iVar22 - 1;
    if (iVar22 == (int)uVar30) {
      local_78 = 0xffffffff;
    }
    std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
    emplace_back<unsigned_int,unsigned_int>
              ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
               __return_storage_ptr__,&local_74,&local_78);
    uVar32 = uVar26;
    uVar19 = uVar30;
  } while( true );
}

Assistant:

Alignment SisdAlignmentEngine::Linear(
    std::uint32_t sequence_len,
    const Graph& graph,
    std::int32_t* score) noexcept {
  std::uint64_t matrix_width = sequence_len + 1;
  const auto& rank_to_node = graph.rank_to_node();

  std::int32_t max_score = type_ == AlignmentType::kSW ? 0 : kNegativeInfinity;
  std::uint32_t max_i = 0;
  std::uint32_t max_j = 0;
  auto update_max_score = [&max_score, &max_i, &max_j] (
      std::int32_t* H_row,
      std::uint32_t i,
      std::uint32_t j) -> void {
    if (max_score < H_row[j]) {
      max_score = H_row[j];
      max_i = i;
      max_j = j;
    }
    return;
  };

  // alignment
  for (const auto& it : rank_to_node) {
    const auto& char_profile =
        &(pimpl_->sequence_profile[it->code * matrix_width]);

    std::uint32_t i = pimpl_->node_id_to_rank[it->id] + 1;
    std::uint32_t pred_i = it->inedges.empty() ?
        0 : pimpl_->node_id_to_rank[it->inedges[0]->tail->id] + 1;

    std::int32_t* H_row = &(pimpl_->H[i * matrix_width]);
    std::int32_t* H_pred_row = &(pimpl_->H[pred_i * matrix_width]);

    // update H
    for (std::uint64_t j = 1; j < matrix_width; ++j) {
      H_row[j] = std::max(
          H_pred_row[j - 1] + char_profile[j],
          H_pred_row[j] + g_);
    }
    // check other predeccessors
    for (std::uint32_t p = 1; p < it->inedges.size(); ++p) {
      pred_i = pimpl_->node_id_to_rank[it->inedges[p]->tail->id] + 1;

      H_pred_row = &(pimpl_->H[pred_i * matrix_width]);

      for (std::uint64_t j = 1; j < matrix_width; ++j) {
        H_row[j] = std::max(
            H_pred_row[j - 1] + char_profile[j],
            std::max(
                H_row[j],
                H_pred_row[j] + g_));
      }
    }

    for (std::uint64_t j = 1; j < matrix_width; ++j) {
      H_row[j] = std::max(H_row[j - 1] + g_, H_row[j]);

      if (type_ == AlignmentType::kSW) {
        H_row[j] = std::max(H_row[j], 0);
        update_max_score(H_row, i, j);
      } else if (type_ == AlignmentType::kNW &&
          it->outedges.empty() && j == matrix_width - 1) {
        update_max_score(H_row, i, j);
      } else if (type_ == AlignmentType::kOV && it->outedges.empty()) {
        update_max_score(H_row, i, j);
      }
    }
  }

  if (max_i == 0 && max_j == 0) {
    return Alignment();
  }
  if (score) {
    *score = max_score;
  }

  // backtrack
  Alignment alignment;
  std::uint32_t i = max_i;
  std::uint32_t j = max_j;

  auto sw_condition = [this, &i, &j, &matrix_width] () -> bool {
    return (pimpl_->H[i * matrix_width + j] == 0) ? false : true;
  };
  auto nw_condition = [&i, &j] () -> bool {
    return (i == 0 && j == 0) ? false : true;
  };
  auto ov_condition = [&i, &j] () -> bool {
    return (i == 0 || j == 0) ? false : true;
  };

  std::uint32_t prev_i = 0;
  std::uint32_t prev_j = 0;
  while ((type_ == AlignmentType::kSW && sw_condition()) ||
         (type_ == AlignmentType::kNW && nw_condition()) ||
         (type_ == AlignmentType::kOV && ov_condition())) {
    auto H_ij = pimpl_->H[i * matrix_width + j];
    bool predecessor_found = false;

    if (i != 0 && j != 0) {
      const auto& it = rank_to_node[i - 1];
      std::int32_t match_cost =
          pimpl_->sequence_profile[it->code * matrix_width + j];

      std::uint32_t pred_i = it->inedges.empty() ?
          0 : pimpl_->node_id_to_rank[it->inedges[0]->tail->id] + 1;

      if (H_ij == pimpl_->H[pred_i * matrix_width + (j - 1)] + match_cost) {
        prev_i = pred_i;
        prev_j = j - 1;
        predecessor_found = true;
      } else {
        for (std::uint32_t p = 1; p < it->inedges.size(); ++p) {
          std::uint32_t pred_i =
              pimpl_->node_id_to_rank[it->inedges[p]->tail->id] + 1;

          if (H_ij == pimpl_->H[pred_i * matrix_width + (j - 1)] + match_cost) {
            prev_i = pred_i;
            prev_j = j - 1;
            predecessor_found = true;
            break;
          }
        }
      }
    }

    if (!predecessor_found && i != 0) {
      const auto& it = rank_to_node[i - 1];

      std::uint32_t pred_i = it->inedges.empty() ? 0 :
          pimpl_->node_id_to_rank[it->inedges[0]->tail->id] + 1;

      if (H_ij == pimpl_->H[pred_i * matrix_width + j] + g_) {
        prev_i = pred_i;
        prev_j = j;
        predecessor_found = true;
      } else {
        for (std::uint32_t p = 1; p < it->inedges.size(); ++p) {
          std::uint32_t pred_i =
              pimpl_->node_id_to_rank[it->inedges[p]->tail->id] + 1;

          if (H_ij == pimpl_->H[pred_i * matrix_width + j] + g_) {
            prev_i = pred_i;
            prev_j = j;
            predecessor_found = true;
            break;
          }
        }
      }
    }

    if (!predecessor_found && H_ij == pimpl_->H[i * matrix_width + j - 1] + g_) {  // NOLINT
      prev_i = i;
      prev_j = j - 1;
      predecessor_found = true;
    }

    alignment.emplace_back(
        i == prev_i ? -1 : rank_to_node[i - 1]->id,
        j == prev_j ? -1 : j - 1);

    i = prev_i;
    j = prev_j;
  }

  std::reverse(alignment.begin(), alignment.end());
  return alignment;
}